

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple_Generator.cc
# Opt level: O2

Triple __thiscall
Triple_Generator::triple_generator(Triple_Generator *this,uint32_t K,uint32_t X,uint32_t LP)

{
  RandNum_Generator *this_00;
  ushort uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint32_t uVar4;
  long lVar5;
  ostream *poVar6;
  uint x;
  Triple TVar7;
  
  if (3 < K) {
    uVar1 = this->Q;
    x = (((J[K - 4] * 0x3e5 + 0xd157) % (uint)uVar1) * X +
        (J[K - 4] * 0x281b + 0x281b) % (uint)uVar1) % (uint)uVar1;
    this_00 = &this->rand;
    lVar5 = RandNum_Generator::generator(this_00,x,0,0x100000);
    uVar4 = Degree_Generator::deg_generator(&this->deg,(int)lVar5);
    (this->triple).d = uVar4;
    lVar5 = RandNum_Generator::generator(this_00,x,1,LP - 1);
    (this->triple).a = (int)lVar5 + 1;
    lVar5 = RandNum_Generator::generator(this_00,x,2,LP);
    TVar7.b = (uint32_t)lVar5;
    (this->triple).b = TVar7.b;
    uVar2 = (this->triple).d;
    uVar3 = (this->triple).a;
    TVar7.a = uVar3;
    TVar7.d = uVar2;
    return TVar7;
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"K is must greater than or equal to 4");
  std::endl<char,std::char_traits<char>>(poVar6);
  exit(-1);
}

Assistant:

struct Triple Triple_Generator::triple_generator(uint32_t K, uint32_t X, uint32_t LP)
{
	uint32_t A = 0;
	uint32_t B = 0;
	uint32_t Y = 0;
	uint32_t v = 0;


	if (K < 4)
	{
		std::cerr << "K is must greater than or equal to 4" << std::endl;
		exit(-1);
	}

	K = K - 4;

	A = (53591 + J[K] * 997) % Q;
	B = (10267 * (J[K] + 1)) % Q;
	Y = (B + X * A) % Q;
	v = rand.generator(Y, 0, (uint32_t)pow(2, 20));
	triple.d = deg.deg_generator(v);
	triple.a = 1 + rand.generator(Y, 1, LP - 1);
	triple.b = rand.generator(Y, 2, LP);

//	printf(" J[K]: %d  A : %d B : %d Y : %d v : %d \n",J[K],A,B,Y,v);

	return triple;
}